

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O3

fields absl::lts_20240722::time_internal::cctz::detail::impl::n_day
                 (year_t y,month_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  fields fVar14;
  
  lVar5 = (cd / 0x23ab1) * 400;
  lVar11 = cd % 0x23ab1;
  lVar10 = lVar5 + -400;
  if (-1 < lVar11) {
    lVar10 = lVar5;
  }
  lVar5 = lVar11 + 0x23ab1;
  if (-1 < lVar11) {
    lVar5 = lVar11;
  }
  uVar13 = (d / 0x23ab1) * 400 + lVar10 + y % 400;
  uVar7 = d % 0x23ab1 + lVar5;
  if (uVar7 == 0 || SCARRY8(d % 0x23ab1,lVar5) != (long)uVar7 < 0) {
    if ((long)uVar7 < -0x16c) {
      uVar13 = uVar13 - 400;
      uVar7 = uVar7 + 0x23ab1;
    }
    else {
      uVar6 = (('\x02' < m) + uVar13) - 1;
      lVar10 = 0x16d;
      if ((uVar6 & 3) == 0) {
        lVar10 = uVar6 * -0x70a3d70a3d70a3d7;
        lVar10 = (ulong)((lVar10 + 0x51eb851eb851eb0U >> 4 | lVar10 << 0x3c) < 0xa3d70a3d70a3d7 ||
                        0x28f5c28f5c28f5c < (lVar10 + 0x51eb851eb851eb8U >> 2 | lVar10 << 0x3e)) +
                 0x16d;
      }
      uVar13 = uVar13 - 1;
      uVar7 = uVar7 + lVar10;
    }
  }
  else if (0x23ab1 < uVar7) {
    uVar13 = uVar13 + 400;
    uVar7 = uVar7 - 0x23ab1;
  }
  if (0x16d < uVar7) {
    uVar12 = (long)(uVar13 + ('\x02' < m)) % 400;
    uVar6 = (ulong)((int)uVar12 + 400);
    if (-1 < (long)uVar12) {
      uVar6 = uVar12 & 0xffffffff;
    }
    uVar12 = (ulong)(300 < (int)uVar6 || (int)uVar6 == 0) | 0x8eac;
    if (uVar12 < uVar7) {
      do {
        uVar7 = uVar7 - uVar12;
        uVar13 = uVar13 + 100;
        iVar4 = 100;
        if (299 < (int)uVar6) {
          iVar4 = -300;
        }
        uVar3 = (int)uVar6 + iVar4;
        uVar6 = (ulong)uVar3;
        uVar12 = (ulong)(300 < (int)uVar3 || uVar3 == 0) | 0x8eac;
      } while (uVar12 < uVar7);
    }
    while( true ) {
      iVar4 = (int)uVar6;
      uVar6 = 0x5b5;
      if (iVar4 < 0x12d && iVar4 != 0) {
        uVar6 = (ulong)((iVar4 + -1) % 100 < 0x60) | 0x5b4;
      }
      uVar8 = uVar7 - uVar6;
      uVar12 = uVar7;
      uVar2 = uVar13;
      if (uVar7 < uVar6 || uVar8 == 0) break;
      uVar13 = uVar13 + 4;
      uVar6 = (ulong)(iVar4 - 0x18c);
      uVar7 = uVar8;
      if (iVar4 < 0x18c) {
        uVar6 = (ulong)(iVar4 + 4);
      }
    }
    do {
      uVar13 = uVar2;
      uVar7 = uVar12;
      uVar6 = ('\x02' < m) + uVar13;
      lVar10 = 0x16d;
      if ((uVar6 & 3) == 0) {
        lVar10 = uVar6 * -0x70a3d70a3d70a3d7;
        lVar10 = (ulong)((lVar10 + 0x51eb851eb851eb0U >> 4 | lVar10 << 0x3c) < 0xa3d70a3d70a3d7 ||
                        0x28f5c28f5c28f5c < (lVar10 + 0x51eb851eb851eb8U >> 2 | lVar10 << 0x3e)) +
                 0x16d;
      }
      uVar12 = uVar7 - lVar10;
      uVar2 = uVar13 + 1;
    } while (uVar7 - lVar10 != 0 && lVar10 <= (long)uVar7);
  }
  if (0x1c < (long)uVar7) {
    while( true ) {
      uVar3 = 0;
      if ((uVar13 & 3) == 0 && m == 2) {
        lVar10 = uVar13 * -0x70a3d70a3d70a3d7;
        uVar3 = 1;
        if ((lVar10 + 0x51eb851eb851eb8U >> 2 | lVar10 << 0x3e) < 0x28f5c28f5c28f5d) {
          uVar3 = (uint)((lVar10 + 0x51eb851eb851eb0U >> 4 | lVar10 << 0x3c) < 0xa3d70a3d70a3d7);
        }
      }
      uVar6 = uVar7 - ((ulong)uVar3 + (long)*(int *)(&DAT_0010c070 + (long)m * 4));
      if (uVar6 == 0 ||
          (long)uVar7 < (long)((ulong)uVar3 + (long)*(int *)(&DAT_0010c070 + (long)m * 4))) break;
      bVar9 = m + 1;
      cVar1 = m - 0xc;
      m = bVar9;
      if (SBORROW1(bVar9,'\r') == cVar1 < '\0') {
        m = 1;
      }
      uVar13 = uVar13 + ('\f' < (char)bVar9);
      uVar7 = uVar6;
    }
  }
  fVar14._8_8_ = (ulong)(byte)m |
                 (ulong)(((uint)uVar7 & 0xff) << 8) |
                 (ulong)(byte)hh << 0x10 | (ulong)CONCAT11(ss,mm) << 0x18;
  fVar14.y = (y - y % 400) + uVar13;
  return fVar14;
}

Assistant:

CONSTEXPR_F fields n_day(year_t y, month_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  year_t ey = y % 400;
  const year_t oey = ey;
  ey += (cd / 146097) * 400;
  cd %= 146097;
  if (cd < 0) {
    ey -= 400;
    cd += 146097;
  }
  ey += (d / 146097) * 400;
  d = d % 146097 + cd;
  if (d > 0) {
    if (d > 146097) {
      ey += 400;
      d -= 146097;
    }
  } else {
    if (d > -365) {
      // We often hit the previous year when stepping a civil time backwards,
      // so special case it to avoid counting up by 100/4/1-year chunks.
      ey -= 1;
      d += days_per_year(ey, m);
    } else {
      ey -= 400;
      d += 146097;
    }
  }
  if (d > 365) {
    int yi = year_index(ey, m);  // Index into Gregorian 400 year cycle.
    for (;;) {
      int n = days_per_century(yi);
      if (d <= n) break;
      d -= n;
      ey += 100;
      yi += 100;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_4years(yi);
      if (d <= n) break;
      d -= n;
      ey += 4;
      yi += 4;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_year(ey, m);
      if (d <= n) break;
      d -= n;
      ++ey;
    }
  }
  if (d > 28) {
    for (;;) {
      int n = days_per_month(ey, m);
      if (d <= n) break;
      d -= n;
      if (++m > 12) {
        ++ey;
        m = 1;
      }
    }
  }
  return fields(y + (ey - oey), m, static_cast<day_t>(d), hh, mm, ss);
}